

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_misc.cpp
# Opt level: O2

void __thiscall
amrex::MLNodeLaplacian::compGrad(MLNodeLaplacian *this,int amrlev,MultiFab *grad,MultiFab *sol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  FabType FVar12;
  uint uVar13;
  EBFArrayBoxFactory *this_00;
  long lVar14;
  int *piVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  void *__s;
  int iVar31;
  long lVar32;
  int iVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  long local_288;
  long local_280;
  long local_268;
  Box local_244;
  long local_228;
  FabArray<amrex::FArrayBox> *local_220;
  FabArray<amrex::EBCellFlagFab> *local_218;
  long local_210;
  long local_208;
  long local_200;
  double local_1f8;
  double local_1f0;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  FabArray<amrex::FArrayBox> *local_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  Array4<double> local_1b8;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_178;
  FabArray<amrex::FArrayBox> *local_170;
  long local_168;
  ulong local_160;
  double local_158;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter mfi;
  
  lVar14 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  local_1c0 = *(double *)(lVar14 + 0x38);
  local_1c8 = *(double *)(lVar14 + 0x40);
  local_1d0 = *(double *)(lVar14 + 0x48);
  lVar14 = **(long **)&(this->super_MLNodeLinOp).super_MLLinOp.m_factory.
                       super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[amrlev].
                       super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ;
  bVar9 = true;
  local_1d8 = &grad->super_FabArray<amrex::FArrayBox>;
  local_170 = &sol->super_FabArray<amrex::FArrayBox>;
  if (lVar14 == 0) {
    local_218 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    local_220 = (FabArray<amrex::FArrayBox> *)0x0;
  }
  else {
    local_218 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    this_00 = (EBFArrayBoxFactory *)
              __dynamic_cast(lVar14,&FabFactory<amrex::FArrayBox>::typeinfo,
                             &EBFArrayBoxFactory::typeinfo,0);
    local_220 = (FabArray<amrex::FArrayBox> *)0x0;
    if (this_00 != (EBFArrayBoxFactory *)0x0) {
      local_218 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_00);
      local_220 = &EBFArrayBoxFactory::getVolFrac(this_00)->super_FabArray<amrex::FArrayBox>;
      bVar9 = false;
    }
  }
  local_178._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (this->m_integral).
       super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
  MFIter::MFIter(&mfi,&local_1d8->super_FabArrayBase,true);
  local_1f0 = local_1c0 * 0.25;
  local_1f8 = local_1c8 * 0.25;
  local_158 = local_1d0 * 0.25;
  do {
    if (mfi.endIndex <= mfi.currentIndex) {
      MFIter::~MFIter(&mfi);
      return;
    }
    MFIter::tilebox(&local_244,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_1b8,local_1d8,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_150,local_170,&mfi);
    iVar22 = local_244.bigend.vect[2];
    iVar31 = local_244.bigend.vect[1];
    iVar21 = local_244.bigend.vect[0];
    uVar13 = local_244.smallend.vect[2];
    iVar10 = local_244.smallend.vect[1];
    iVar8 = local_244.smallend.vect[0];
    local_288 = (long)local_244.smallend.vect[0];
    local_268 = (long)local_244.smallend.vect[1];
    uVar11 = local_244.bigend.vect[0] - local_244.smallend.vect[0];
    local_280 = 0;
    dVar34 = local_1f0;
    dVar35 = local_1f8;
    for (lVar14 = 0; uVar26 = uVar13, lVar14 != 3; lVar14 = lVar14 + 1) {
      for (; (int)uVar26 <= iVar22; uVar26 = uVar26 + 1) {
        lVar23 = local_1b8.jstride * 8;
        __s = (void *)((long)local_1b8.p +
                      local_1b8.nstride * local_280 +
                      (local_268 - local_1b8.begin.y) * lVar23 +
                      (int)(uVar26 - local_1b8.begin.z) * local_1b8.kstride * 8 +
                      (long)local_1b8.begin.x * -8 + local_288 * 8);
        for (iVar33 = iVar10; iVar33 <= iVar31; iVar33 = iVar33 + 1) {
          if (iVar8 <= iVar21) {
            memset(__s,0,(ulong)uVar11 * 8 + 8);
            dVar34 = local_1f0;
            dVar35 = local_1f8;
          }
          __s = (void *)((long)__s + lVar23);
        }
      }
      local_280 = local_280 + 8;
    }
    if (bVar9) {
LAB_00562807:
      local_228 = local_288 * 8;
      lVar14 = (long)(int)uVar13;
      while (uVar13 = uVar13 + 1, (int)lVar14 <= iVar22) {
        local_210 = lVar14 + 1;
        lVar16 = (long)local_1b8.begin.x;
        lVar19 = (lVar14 - local_1b8.begin.z) * local_1b8.kstride;
        local_208 = CONCAT44(local_208._4_4_,uVar13);
        lVar17 = (long)(int)(uVar13 - local_150.begin.z) * local_150.kstride * 8 +
                 (long)local_150.begin.x * -8;
        lVar18 = (lVar14 - local_150.begin.z) * local_150.kstride * 8 + (long)local_150.begin.x * -8
        ;
        local_200 = (long)local_150.p + lVar18 + local_228 + 8;
        lVar23 = local_268;
        while (lVar14 = local_210, lVar23 <= iVar31) {
          if (iVar21 < iVar8) {
            lVar23 = lVar23 + 1;
          }
          else {
            lVar14 = lVar23 + 1;
            lVar28 = (lVar23 - local_1b8.begin.y) * local_1b8.jstride * 8;
            lVar24 = lVar28 + lVar19 * 8 + lVar16 * -8 + local_228;
            lVar27 = lVar28 + local_1b8.nstride * 8 + lVar19 * 8 + lVar16 * -8 + local_228;
            lVar28 = lVar28 + local_1b8.nstride * 0x10 + lVar19 * 8 + lVar16 * -8 + local_228;
            lVar25 = (lVar23 - local_150.begin.y) * local_150.jstride * 8;
            lVar29 = lVar25 + lVar17 + local_228 + 8;
            lVar25 = lVar25 + local_200;
            lVar20 = (long)((int)lVar14 - local_150.begin.y) * local_150.jstride * 8;
            lVar32 = lVar20 + lVar17 + local_228;
            lVar20 = lVar20 + lVar18 + local_228;
            lVar30 = 0;
            do {
              *(double *)((long)local_1b8.p + lVar30 * 8 + lVar24) =
                   (((((((*(double *)(lVar25 + lVar30 * 8) - *(double *)(lVar25 + -8 + lVar30 * 8))
                        - *(double *)((long)local_150.p + lVar30 * 8 + lVar20)) +
                       *(double *)((long)local_150.p + lVar30 * 8 + lVar20 + 8)) -
                      *(double *)((long)local_150.p + lVar30 * 8 + lVar29 + -8)) +
                     *(double *)((long)local_150.p + lVar30 * 8 + lVar29)) -
                    *(double *)((long)local_150.p + lVar30 * 8 + lVar32)) +
                   *(double *)((long)local_150.p + lVar30 * 8 + lVar32 + 8)) * dVar34 +
                   *(double *)((long)local_1b8.p + lVar30 * 8 + lVar24);
              *(double *)((long)local_1b8.p + lVar30 * 8 + lVar27) =
                   (((((-*(double *)(lVar25 + -8 + lVar30 * 8) - *(double *)(lVar25 + lVar30 * 8)) +
                       *(double *)((long)local_150.p + lVar30 * 8 + lVar20) +
                      *(double *)((long)local_150.p + lVar30 * 8 + lVar20 + 8)) -
                     *(double *)((long)local_150.p + lVar30 * 8 + lVar29 + -8)) -
                    *(double *)((long)local_150.p + lVar30 * 8 + lVar29)) +
                    *(double *)((long)local_150.p + lVar30 * 8 + lVar32) +
                   *(double *)((long)local_150.p + lVar30 * 8 + lVar32 + 8)) * dVar35 +
                   *(double *)((long)local_1b8.p + lVar30 * 8 + lVar27);
              *(double *)((long)local_1b8.p + lVar30 * 8 + lVar28) =
                   ((((-*(double *)(lVar25 + -8 + lVar30 * 8) - *(double *)(lVar25 + lVar30 * 8)) -
                     *(double *)((long)local_150.p + lVar30 * 8 + lVar20)) -
                    *(double *)((long)local_150.p + lVar30 * 8 + lVar20 + 8)) +
                    *(double *)((long)local_150.p + lVar30 * 8 + lVar29 + -8) +
                    *(double *)((long)local_150.p + lVar30 * 8 + lVar29) +
                    *(double *)((long)local_150.p + lVar30 * 8 + lVar32) +
                   *(double *)((long)local_150.p + lVar30 * 8 + lVar32 + 8)) * local_158 +
                   *(double *)((long)local_1b8.p + lVar30 * 8 + lVar28);
              lVar30 = lVar30 + 1;
              lVar23 = lVar14;
            } while ((iVar21 - (int)local_288) + 1 != (int)lVar30);
          }
        }
      }
    }
    else {
      piVar15 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar15 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      FVar12 = EBCellFlagFab::getType
                         ((local_218->m_fabs_v).
                          super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[*piVar15],&local_244);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_d0,local_220,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,
                 (FabArray<amrex::FArrayBox> *)
                 local_178._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
      if (FVar12 != covered) {
        if (FVar12 != singlevalued) {
          local_268 = (long)local_244.smallend.vect[1];
          local_288 = (long)local_244.smallend.vect[0];
          dVar34 = local_1f0;
          dVar35 = local_1f8;
          iVar31 = local_244.bigend.vect[1];
          iVar21 = local_244.bigend.vect[0];
          uVar13 = local_244.smallend.vect[2];
          iVar22 = local_244.bigend.vect[2];
          iVar8 = local_244.smallend.vect[0];
          goto LAB_00562807;
        }
        local_168 = (long)local_244.smallend.vect[0];
        local_1e4 = local_244.smallend.vect[1];
        local_208 = (long)local_244.bigend.vect[0];
        local_1dc = local_244.bigend.vect[1];
        local_1e0 = local_244.bigend.vect[2];
        uVar13 = local_244.smallend.vect[2];
        while (uVar11 = uVar13, (int)uVar11 <= local_244.bigend.vect[2]) {
          uVar13 = uVar11 + 1;
          local_228 = CONCAT44(local_228._4_4_,uVar13);
          iVar22 = local_244.smallend.vect[1];
          while (local_160 = (ulong)uVar11, iVar22 <= local_244.bigend.vect[1]) {
            lVar16 = (long)iVar22;
            lVar27 = (long)(int)uVar11;
            lVar18 = (iVar22 - local_150.begin.y) * local_150.jstride;
            lVar32 = (int)(uVar11 - local_150.begin.z) * local_150.kstride;
            iVar22 = iVar22 + 1;
            local_210 = CONCAT44(local_210._4_4_,iVar22);
            lVar23 = (iVar22 - local_150.begin.y) * local_150.jstride;
            lVar24 = (int)(uVar13 - local_150.begin.z) * local_150.kstride;
            lVar19 = (lVar16 - local_110.begin.y) * local_110.jstride;
            lVar29 = (lVar27 - local_110.begin.z) * local_110.kstride;
            lVar17 = (lVar16 - local_1b8.begin.y) * local_1b8.jstride;
            lVar28 = (lVar27 - local_1b8.begin.z) * local_1b8.kstride;
            local_200 = local_110.nstride * 0x30;
            lVar14 = local_168;
            while (lVar14 <= local_208) {
              dVar34 = local_d0.p
                       [(lVar16 - local_d0.begin.y) * local_d0.jstride +
                        (lVar27 - local_d0.begin.z) * local_d0.kstride + (lVar14 - local_d0.begin.x)
                       ];
              if ((dVar34 != 0.0) || (NAN(dVar34))) {
                lVar20 = lVar14 - local_150.begin.x;
                dVar35 = local_150.p[lVar18 + lVar20 + lVar32];
                lVar30 = (long)((int)(lVar14 + 1) - local_150.begin.x);
                dVar1 = local_150.p[lVar18 + lVar20 + lVar24];
                dVar2 = local_150.p[lVar18 + lVar30 + lVar32];
                dVar3 = local_150.p[lVar18 + lVar30 + lVar24];
                dVar4 = local_150.p[lVar23 + lVar20 + lVar32];
                dVar5 = local_150.p[lVar23 + lVar30 + lVar32];
                dVar6 = local_150.p[lVar23 + lVar20 + lVar24];
                dVar7 = local_150.p[lVar23 + lVar30 + lVar24];
                dVar36 = ((dVar7 - dVar6) - dVar3) + dVar1;
                dVar38 = ((((dVar5 + dVar36) - dVar4) - dVar2) + dVar35) / dVar34;
                dVar37 = ((((((dVar3 + (dVar7 - dVar6)) - dVar1) - dVar5) + dVar4) - dVar2) + dVar35
                         ) / dVar34;
                dVar36 = (((dVar36 - dVar5) + dVar4 + dVar2) - dVar35) / dVar34;
                lVar20 = lVar14 - local_110.begin.x;
                lVar30 = lVar14 - local_1b8.begin.x;
                dVar34 = ((((((dVar6 + dVar7) - dVar3) - dVar1) - dVar5) - dVar4) + dVar2 + dVar35)
                         / dVar34;
                local_1b8.p[lVar17 + lVar28 + lVar30] =
                     (local_110.p[lVar19 + lVar29 + lVar20 + local_110.nstride * 8] * dVar36 +
                     local_110.p[lVar19 + lVar29 + lVar20 + local_110.nstride * 2] * 0.5 * dVar37 +
                     local_110.p[lVar19 + lVar29 + lVar20 + local_110.nstride] * 0.5 * dVar38 +
                     (((((((dVar2 - dVar35) - dVar4) + dVar5) - dVar1) + dVar3) - dVar6) + dVar7) *
                     0.25) * local_1c0 + local_1b8.p[lVar17 + lVar28 + lVar30];
                local_1b8.p[lVar17 + lVar28 + lVar30 + local_1b8.nstride] =
                     (local_110.p[lVar19 + lVar29 + lVar20 + local_110.nstride * 7] * dVar36 +
                     local_110.p[lVar19 + lVar29 + lVar20 + local_110.nstride * 2] * 0.5 * dVar34 +
                     local_110.p[lVar19 + lVar29 + lVar20] * 0.5 * dVar38 +
                     (((((-dVar35 - dVar2) + dVar4 + dVar5) - dVar1) - dVar3) + dVar6 + dVar7) *
                     0.25) * local_1c8 + local_1b8.p[lVar17 + lVar28 + lVar30 + local_1b8.nstride];
                local_1b8.p[lVar17 + lVar28 + lVar30 + local_1b8.nstride * 2] =
                     (dVar36 * local_110.p[lVar19 + lVar29 + lVar20 + local_110.nstride * 6] +
                     local_110.p[lVar19 + lVar29 + lVar20 + local_110.nstride] * 0.5 * dVar34 +
                     local_110.p[lVar19 + lVar29 + lVar20] * 0.5 * dVar37 +
                     ((((-dVar35 - dVar2) - dVar4) - dVar5) + dVar1 + dVar3 + dVar6 + dVar7) * 0.25)
                     * local_1d0 + local_1b8.p[lVar17 + lVar28 + lVar30 + local_1b8.nstride * 2];
                lVar14 = lVar14 + 1;
              }
              else {
                lVar20 = lVar14 - local_1b8.begin.x;
                local_1b8.p[lVar17 + lVar28 + lVar20 + local_1b8.nstride * 2] = 0.0;
                local_1b8.p[lVar17 + lVar28 + lVar20 + local_1b8.nstride] = 0.0;
                local_1b8.p[lVar17 + lVar28 + lVar20] = 0.0;
                lVar14 = lVar14 + 1;
              }
            }
          }
        }
      }
    }
    MFIter::operator++(&mfi);
  } while( true );
}

Assistant:

void
MLNodeLaplacian::compGrad (int amrlev, MultiFab& grad, MultiFab& sol) const
{
#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    Real sigma = Real(-1.0);

    AMREX_ASSERT(grad.nComp() >= AMREX_SPACEDIM);

    const auto dxinv = m_geom[amrlev][0].InvCellSizeArray();
#ifdef AMREX_USE_EB
    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
    const MultiFab* intg = m_integral[amrlev].get();
#endif

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(grad, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& garr = grad.array(mfi);
        Array4<Real const> const& solarr = sol.const_array(mfi);

        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, AMREX_SPACEDIM, i, j, k, n,
        {
            garr(i,j,k,n) = 0.0;
        });

#ifdef AMREX_USE_EB
        bool regular = !factory;
        if (factory)
        {
            auto type = (*flags)[mfi].getType(bx);
            Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
            Array4<Real const> const& intgarr = intg->const_array(mfi);
            if (type == FabType::covered)
            { }
            else if (type == FabType::singlevalued)
            {
              AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
              {
                  mlndlap_mknewu_eb_c(i,j,k, garr, solarr, sigma, vfracarr, intgarr, dxinv);
              });
            }
            else
            {
                regular = true;
            }
        }
        if (regular)
#endif
        {

#if (AMREX_SPACEDIM == 2)
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
            {
                mlndlap_mknewu_c(i,j,k,garr,solarr,sigma,dxinv,is_rz);
            });
#else
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
            {
                mlndlap_mknewu_c(i,j,k,garr,solarr,sigma,dxinv);
            });
#endif
        }
    }
}